

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O2

Flag __thiscall
Js::ConfigFlagsTable::GetNextChildFlag(ConfigFlagsTable *this,Flag parentFlag,Flag currentChildFlag)

{
  int i;
  ulong uVar1;
  undefined6 in_register_00000012;
  
  uVar1 = 0;
  if (1 < (ushort)(currentChildFlag - InvalidFlag)) {
    uVar1 = (CONCAT62(in_register_00000012,currentChildFlag) & 0xffffffff) + 1;
  }
  for (; uVar1 < 0x1d6; uVar1 = uVar1 + 1) {
    if ((&FlagParents)[uVar1] == parentFlag) goto LAB_00352f13;
  }
  uVar1 = 0x1d7;
LAB_00352f13:
  return (Flag)uVar1;
}

Assistant:

Flag
    ConfigFlagsTable::GetNextChildFlag(Flag parentFlag, Flag currentChildFlag)  const
    {
        // start at the current+1
        int startIndex = (int)currentChildFlag + 1;

        // otherwise start from beginning
        if (currentChildFlag == InvalidFlag || currentChildFlag == NoParentFlag)
        {
            // reset the start index
            startIndex = 0;
        }

        for(int i=startIndex; i < FlagCount; i++)
        {
            Flag currentFlag = (Flag)i;
            Flag parentFlagForCurrentFlag = GetParentFlag(currentFlag);

            if(parentFlagForCurrentFlag == parentFlag)
            {
                // found a match
                return currentFlag;
            }
        }

        // no more
        return InvalidFlag;
    }